

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-server.c
# Opt level: O0

_Bool ssh2_connection_parse_global_request(ssh2_connection_state *s,ptrlen type,PktIn *pktin)

{
  _Bool _Var1;
  char *pcVar2;
  unsigned_long uVar3;
  ptrlen pVar4;
  _Bool toret_1;
  uint port_1;
  char *host_1;
  _Bool toret;
  uint port;
  char *host;
  PktIn *pktin_local;
  ssh2_connection_state *s_local;
  ptrlen type_local;
  
  _Var1 = ptrlen_eq_string(type,"tcpip-forward");
  if (_Var1) {
    pVar4 = BinarySource_get_string(pktin->binarysource_);
    pcVar2 = mkstr(pVar4);
    uVar3 = BinarySource_get_uint32(pktin->binarysource_);
    type_local.len._7_1_ =
         portfwdmgr_listen(s->portfwdmgr,pcVar2,(int)uVar3,pcVar2,(int)uVar3,s->conf);
    safefree(pcVar2);
  }
  else {
    _Var1 = ptrlen_eq_string(type,"cancel-tcpip-forward");
    if (_Var1) {
      pVar4 = BinarySource_get_string(pktin->binarysource_);
      pcVar2 = mkstr(pVar4);
      uVar3 = BinarySource_get_uint32(pktin->binarysource_);
      type_local.len._7_1_ = portfwdmgr_unlisten(s->portfwdmgr,pcVar2,(int)uVar3);
      safefree(pcVar2);
    }
    else {
      type_local.len._7_1_ = false;
    }
  }
  return type_local.len._7_1_;
}

Assistant:

bool ssh2_connection_parse_global_request(
    struct ssh2_connection_state *s, ptrlen type, PktIn *pktin)
{
    if (ptrlen_eq_string(type, "tcpip-forward")) {
        char *host = mkstr(get_string(pktin));
        unsigned port = get_uint32(pktin);
        /* In SSH-2, the host/port we listen on are the same host/port
         * we want reported back to us when a connection comes in,
         * because that's what we tell the client */
        bool toret = portfwdmgr_listen(
            s->portfwdmgr, host, port, host, port, s->conf);
        sfree(host);
        return toret;
    } else if (ptrlen_eq_string(type, "cancel-tcpip-forward")) {
        char *host = mkstr(get_string(pktin));
        unsigned port = get_uint32(pktin);
        bool toret = portfwdmgr_unlisten(s->portfwdmgr, host, port);
        sfree(host);
        return toret;
    } else {
        /* Unrecognised request. */
        return false;
    }
}